

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

lys_node * lys_is_disabled(lys_node *node,int recursive)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  if (node != (lys_node *)0x0) {
    while( true ) {
      if ((node->nodetype != LYS_INPUT) && (node->nodetype != LYS_OUTPUT)) {
        lVar2 = 0;
        uVar3 = 0xffffffffffffffff;
        while (uVar3 = uVar3 + 1, uVar3 < node->iffeature_size) {
          iVar1 = resolve_iffeature((lys_iffeature *)((long)&node->iffeature->expr + lVar2));
          lVar2 = lVar2 + 0x20;
          if (iVar1 == 0) {
            return node;
          }
        }
      }
      if (recursive == 0) break;
      if (node->nodetype == LYS_AUGMENT) {
        node = node->prev;
      }
      else {
        node = node->parent;
      }
      if (node == (lys_node *)0x0) {
        return (lys_node *)0x0;
      }
      if ((recursive == 2) &&
         ((node->nodetype & (LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) != LYS_UNKNOWN)) {
        return (lys_node *)0x0;
      }
    }
  }
  return (lys_node *)0x0;
}

Assistant:

lys_node *
lys_is_disabled(const struct lys_node *node, int recursive)
{
    int i;

    if (!node) {
        return NULL;
    }

check:
    if (node->nodetype != LYS_INPUT && node->nodetype != LYS_OUTPUT) {
        /* input/output does not have if-feature, so skip them */

        /* check local if-features */
        for (i = 0; i < node->iffeature_size; i++) {
            if (!resolve_iffeature(&node->iffeature[i])) {
                return node;
            }
        }
    }

    if (!recursive) {
        return NULL;
    }

    /* go through parents */
    if (node->nodetype == LYS_AUGMENT) {
        /* go to parent actually means go to the target node */
        node = ((struct lys_node_augment *)node)->target;
        if (!node) {
            /* unresolved augment, let's say it's enabled */
            return NULL;
        }
    } else if (node->parent) {
        node = node->parent;
    } else {
        return NULL;
    }

    if (recursive == 2) {
        /* continue only if the node cannot have a data instance */
        if (node->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST)) {
            return NULL;
        }
    }
    goto check;
}